

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_matrix.cpp
# Opt level: O1

uint __thiscall
ON_SubDSectorType::GetAllEigenvalues
          (ON_SubDSectorType *this,double *eigenvalues,size_t eigenvalues_capacity)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  int iVar3;
  bool bVar4;
  ON_SubDVertexTag vertex_tag;
  uint R;
  uint uVar5;
  uint uVar6;
  size_t i;
  size_t sVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  uint uVar15;
  uint uVar16;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 uVar17;
  undefined4 extraout_XMM0_Dc_02;
  uint extraout_XMM0_Dd;
  uint uVar18;
  uint extraout_XMM0_Dd_00;
  uint uVar19;
  uint extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  undefined8 in_XMM6_Qb;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  uint local_90;
  int local_8c;
  undefined8 local_88;
  
  if (eigenvalues_capacity == 0) {
    eigenvalues = (double *)0x0;
  }
  else {
    if (eigenvalues == (double *)0x0) goto LAB_0062b87e;
    sVar7 = 0;
    do {
      eigenvalues[sVar7] = -1.23432101234321e+308;
      sVar7 = sVar7 + 1;
    } while (eigenvalues_capacity != sVar7);
  }
  bVar4 = IsValid(this);
  if (((bVar4) && (R = PointRingCount(this), R != 0)) &&
     (eigenvalues == (double *)0x0 || R <= eigenvalues_capacity)) {
    vertex_tag = VertexTag(this);
    uVar5 = EdgeCount(this);
    bVar4 = ON_SubD::IsValidSectorEdgeCount(vertex_tag,uVar5);
    if (bVar4) {
      if (vertex_tag == Smooth) {
        if (eigenvalues == (double *)0x0) {
          return R;
        }
        *eigenvalues = 1.0;
        dVar23 = (double)((uVar5 * 5 + -0x1e) * uVar5 + 0x31);
        if (dVar23 < 0.0) {
          dVar23 = sqrt(dVar23);
        }
        else {
          dVar23 = SQRT(dVar23);
        }
        dVar22 = (double)(uVar5 * 3 - 7);
        dVar20 = 0.125;
        uVar8 = uVar5;
        uVar6 = uVar5;
        if ((uVar5 & 1) == 0 && uVar5 != 0) {
          do {
            uVar6 = uVar8 >> 1;
            dVar20 = dVar20 * 0.5;
            if (uVar8 == 0) break;
            uVar9 = uVar8 & 2;
            uVar8 = uVar6;
          } while (uVar9 == 0);
        }
        eigenvalues[1] = (dVar23 + dVar22) * (dVar20 / (double)uVar6);
        eigenvalues[2] = (dVar22 - dVar23) * (dVar20 / (double)uVar6);
        if (1 < uVar5) {
          uVar8 = uVar5 * 2;
          local_90 = 2;
          local_8c = -1;
          uVar6 = 1;
          lVar10 = 0;
          do {
            uVar8 = uVar8 - 2;
            iVar3 = (int)lVar10;
            uVar11 = iVar3 + 2;
            uVar9 = uVar11;
            if (uVar5 < uVar11) {
              uVar9 = uVar8;
            }
            uVar18 = uVar5 - uVar9;
            if (uVar9 * 2 <= uVar5) {
              uVar18 = uVar9;
            }
            dVar23 = eigenvalue_cos(uVar18,uVar5);
            uVar13 = SUB84(dVar23,0);
            uVar15 = (uint)((ulong)dVar23 >> 0x20);
            uVar18 = extraout_XMM0_Dd;
            if (uVar5 < uVar9 * 2) {
              uVar15 = uVar15 ^ 0x80000000;
              uVar18 = extraout_XMM0_Dd ^ 0x80000000;
            }
            uVar9 = local_90;
            if (uVar5 < local_90) {
              uVar9 = uVar5;
            }
            dVar23 = eigenvalue_cos(uVar9 + local_8c,uVar5);
            uVar14 = SUB84(dVar23,0);
            uVar16 = (uint)((ulong)dVar23 >> 0x20);
            uVar19 = extraout_XMM0_Dd_00;
            if (uVar5 < uVar11) {
              uVar16 = uVar16 ^ 0x80000000;
              uVar19 = extraout_XMM0_Dd_00 ^ 0x80000000;
            }
            local_88 = (double)CONCAT44(uVar16,uVar14);
            dVar23 = ((double)uVar6 * 3.141592653589793) / (double)uVar5;
            dVar22 = cos(dVar23 + dVar23);
            if (1e-06 < ABS((double)CONCAT44(uVar15,uVar13) - dVar22)) {
              ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd_matrix.cpp"
                         ,0x74,"","bogus c1");
            }
            dVar23 = cos(dVar23);
            if (1e-06 < ABS(local_88 - dVar23)) {
              ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd_matrix.cpp"
                         ,0x79,"","bogus c2");
            }
            dVar23 = (double)CONCAT44(uVar15,uVar13);
            dVar22 = dVar23 + 5.0;
            if ((uVar9 + local_8c) * 4 == uVar5) {
              dVar23 = dVar23 / 9.0 + 1.0;
              if (dVar23 < 0.0) {
                dVar23 = sqrt(dVar23);
                uVar17 = extraout_XMM0_Dc_01;
                uVar18 = extraout_XMM0_Dd_01;
              }
              else {
                dVar23 = SQRT(dVar23);
                uVar17 = extraout_XMM0_Dc;
              }
              uVar12 = -(ulong)((double)CONCAT44(uVar16,uVar14) < 0.0);
              uVar2 = (CONCAT44(uVar18,uVar17) ^ 0x8000000000000000) &
                      CONCAT44(uVar19,extraout_XMM0_Dc_00);
              auVar25._0_8_ = ~uVar12 & (ulong)dVar23;
              auVar25._8_8_ = ~CONCAT44(uVar19,extraout_XMM0_Dc_00) & CONCAT44(uVar18,uVar17);
              auVar1._8_4_ = (int)uVar2;
              auVar1._0_8_ = (ulong)-dVar23 & uVar12;
              auVar1._12_4_ = (int)(uVar2 >> 0x20);
              auVar26 = auVar25 | auVar1;
            }
            else {
              dVar23 = dVar23 / 4.5 + 2.0;
              if (dVar23 < 0.0) {
                dVar23 = sqrt(dVar23);
                in_XMM6_Qb = CONCAT44(extraout_XMM0_Dd_02,extraout_XMM0_Dc_02);
              }
              else {
                dVar23 = SQRT(dVar23);
              }
              auVar26._0_8_ = dVar23 * (double)CONCAT44(uVar16,uVar14);
              auVar26._8_8_ = in_XMM6_Qb;
            }
            in_XMM6_Qb = auVar26._8_8_;
            dVar24 = auVar26._0_8_ * 3.0;
            dVar21 = (double)CONCAT44(uVar15,uVar13) + (double)CONCAT44(uVar15,uVar13) + 18.0;
            dVar20 = SQRT(dVar21);
            dVar23 = dVar20;
            if (dVar21 < 0.0) {
              dVar23 = sqrt(dVar21);
            }
            if (dVar21 < 0.0) {
              dVar20 = sqrt(dVar21);
            }
            dVar21 = (dVar22 - dVar24) * 0.0625;
            if (1e-06 < ABS((dVar22 - dVar23 * (double)CONCAT44(uVar16,uVar14)) * 0.0625 - dVar21))
            {
              ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd_matrix.cpp"
                         ,0x8a,"","bogus lambda0");
            }
            dVar23 = (dVar22 + dVar24) * 0.0625;
            if (1e-06 < ABS(((double)CONCAT44(uVar16,uVar14) * dVar20 + dVar22) * 0.0625 - dVar23))
            {
              ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd_matrix.cpp"
                         ,0x8f,"","bogus lambda1");
            }
            eigenvalues[iVar3 + 3] = dVar21;
            eigenvalues[iVar3 + 4] = dVar23;
            lVar10 = lVar10 + 2;
            local_90 = local_90 + 2;
            local_8c = local_8c + -1;
            uVar6 = uVar6 + 1;
          } while ((ulong)uVar5 * 2 + -2 != lVar10);
        }
        ON_SortDoubleArrayDecreasing(eigenvalues + 1,(ulong)(R - 1));
      }
      else if (uVar5 < 0x15 && vertex_tag == Crease) {
        if (eigenvalues == (double *)0x0) {
          return R;
        }
        uVar5 = GetQuadCreaseEigenvalues(uVar5,R,eigenvalues);
        if (((R != uVar5) || (*eigenvalues != 1.0)) || (NAN(*eigenvalues))) goto LAB_0062b87e;
      }
      if (eigenvalues == (double *)0x0) {
        return 0;
      }
      if ((*eigenvalues == 1.0) && (!NAN(*eigenvalues))) {
        return R;
      }
    }
  }
LAB_0062b87e:
  ON_SubDIncrementErrorCount();
  return 0;
}

Assistant:

unsigned int ON_SubDSectorType::GetAllEigenvalues(
  double* eigenvalues,
  size_t eigenvalues_capacity
  )
{
  if ( 0 == eigenvalues_capacity)
    eigenvalues = nullptr;
  else
  {
    if (nullptr == eigenvalues)
      return ON_SUBD_RETURN_ERROR(0);

    for (size_t i = 0; i < eigenvalues_capacity; i++)
      eigenvalues[i] = ON_UNSET_VALUE;
  }

  if (false == IsValid())
    return ON_SUBD_RETURN_ERROR(0);

  const unsigned int R = PointRingCount();
  if ( 0  == R || (nullptr != eigenvalues && eigenvalues_capacity < R))
    return ON_SUBD_RETURN_ERROR(0);

  const ON_SubDVertexTag vertex_tag = VertexTag();
  const unsigned int N = EdgeCount();

  if (false == ON_SubD::IsValidSectorEdgeCount(vertex_tag, N))
    return ON_SUBD_RETURN_ERROR(0);

  if (ON_SubDVertexTag::Smooth == vertex_tag)
  {
    if (nullptr == eigenvalues)
    {
      // caller is asking if eigenvalues are available
      return R;
    }
    eigenvalues[0] = 1.0;

    double a = (3 * N - 7);
    double b = (N >= 6) ? ((5 * N - 30)*N + 49) : ((5 * N*N + 49) - 30 * N);
    double c = sqrt(b);
    double d = 0.125;
    unsigned int D = N;
    while (D > 0 && 0 == (D % 2))
    {
      D /= 2;
      d *= 0.5;
    }
    d /= ((double)D);

    eigenvalues[1] = d*(a + c);
    eigenvalues[2] = d*(a - c);

    for (unsigned int k = 1; k < N; k++)
    {
      double e2[2];
      GetQuadSubdivisionMatrix_eigenvalue_pair(k, N, e2);
      eigenvalues[2 * k + 1] = e2[0];
      eigenvalues[2 * k + 2] = e2[1];
    }

    // return sorted in decreasing order
    ON_SortDoubleArrayDecreasing(eigenvalues + 1, R - 1);
  }
  else if (ON_SubDVertexTag::Crease == vertex_tag)
  {
    if (N <= 20)
    {
      if (nullptr == eigenvalues)
      {
        // caller is asking if eigenvalues are available
        return R;
      }
      if (R != GetQuadCreaseEigenvalues(N, R, eigenvalues) || !(1.0 == eigenvalues[0]))
        return ON_SUBD_RETURN_ERROR(0);
    }
  }

  if (nullptr == eigenvalues)
  {
    // caller is asking if eigenvalues are available
    return 0; // not an error
  }

  if (!(1.0 == eigenvalues[0]))
    return ON_SUBD_RETURN_ERROR(0);

  return R;
}